

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O1

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)

{
  postfiltdata->STATE_0_UPPER[4] = 0.0;
  postfiltdata->STATE_0_UPPER[5] = 0.0;
  postfiltdata->STATE_0_UPPER[2] = 0.0;
  postfiltdata->STATE_0_UPPER[3] = 0.0;
  postfiltdata->STATE_0_UPPER[0] = 0.0;
  postfiltdata->STATE_0_UPPER[1] = 0.0;
  postfiltdata->STATE_0_LOWER[4] = 0.0;
  postfiltdata->STATE_0_LOWER[5] = 0.0;
  postfiltdata->STATE_0_LOWER[2] = 0.0;
  postfiltdata->STATE_0_LOWER[3] = 0.0;
  postfiltdata->STATE_0_LOWER[0] = 0.0;
  postfiltdata->STATE_0_LOWER[1] = 0.0;
  postfiltdata->STATE_0_LOWER_float[0] = 0.0;
  postfiltdata->STATE_0_LOWER_float[1] = 0.0;
  postfiltdata->STATE_0_LOWER_float[2] = 0.0;
  postfiltdata->STATE_0_LOWER_float[3] = 0.0;
  postfiltdata->STATE_0_LOWER_float[4] = 0.0;
  postfiltdata->STATE_0_LOWER_float[5] = 0.0;
  postfiltdata->STATE_0_UPPER_float[0] = 0.0;
  postfiltdata->STATE_0_UPPER_float[1] = 0.0;
  postfiltdata->STATE_0_UPPER_float[2] = 0.0;
  postfiltdata->STATE_0_UPPER_float[3] = 0.0;
  postfiltdata->STATE_0_UPPER_float[4] = 0.0;
  postfiltdata->STATE_0_UPPER_float[5] = 0.0;
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;
  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;
  postfiltdata->HPstates1_float[0] = 0.0;
  postfiltdata->HPstates1_float[1] = 0.0;
  postfiltdata->HPstates2_float[0] = 0.0;
  postfiltdata->HPstates2_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)
{
  int k;

  for (k = 0; k < 2*POSTQORDER; k++) {
    postfiltdata->STATE_0_LOWER[k] = 0;
    postfiltdata->STATE_0_UPPER[k] = 0;

    postfiltdata->STATE_0_LOWER_float[k] = 0;
    postfiltdata->STATE_0_UPPER_float[k] = 0;
  }

  /* High pass filter states */
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;

  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;

  postfiltdata->HPstates1_float[0] = 0.0f;
  postfiltdata->HPstates1_float[1] = 0.0f;

  postfiltdata->HPstates2_float[0] = 0.0f;
  postfiltdata->HPstates2_float[1] = 0.0f;

  return;
}